

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

int dodown(void)

{
  uint uVar1;
  uint uVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  trap *ptVar7;
  obj **otmp;
  char *pcVar8;
  obj *poVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  
  if ((u.ux != (level->dnstair).sx) || (bVar11 = true, u.uy != (level->dnstair).sy)) {
    if ((u.ux == (level->sstairs).sx) && (u.uy == (level->sstairs).sy)) {
      bVar11 = (level->sstairs).up == '\0';
    }
    else {
      bVar11 = false;
    }
  }
  if (u.ux == (level->dnladder).sx) {
    bVar12 = u.uy == (level->dnladder).sy;
  }
  else {
    bVar12 = false;
  }
  if (u.usteed != (monst *)0x0) {
    if (((u.usteed)->field_0x62 & 4) == 0) {
      pcVar6 = Monnam(u.usteed);
      pcVar8 = "%s won\'t move!";
      goto LAB_0016cede;
    }
    if ((u.usteed)->meating != 0) {
      pcVar6 = Monnam(u.usteed);
      pcVar8 = "%s is still eating.";
      goto LAB_0016cede;
    }
  }
  if (u.uprops[0x12].intrinsic != 0 || u.uprops[0x12].extrinsic != 0) {
    if ((u.uprops[0x12].extrinsic & 0x2000) != 0 || (u.uprops[0x12].intrinsic & 0x10000000) != 0) {
      if ((u.uprops[0x12].extrinsic >> 0xd & 1) != 0) {
        otmp = &invent;
        while (otmp = &((obj *)otmp)->nobj->nobj, (obj *)otmp != (obj *)0x0) {
          if ((((obj *)otmp)->oartifact != '\0') &&
             (poVar9 = (obj *)otmp, bVar3 = artifact_has_invprop((obj *)otmp,'\x12'), uVar2 = moves,
             bVar3 != '\0')) {
            uVar1 = ((obj *)otmp)->age;
            iVar5 = rnz((int)poVar9);
            if (uVar2 <= uVar1) {
              uVar2 = ((obj *)otmp)->age;
            }
            ((obj *)otmp)->age = iVar5 + uVar2;
          }
        }
      }
      iVar5 = float_down(0x10ffffff,0x2000);
      if (iVar5 != 0) {
        return 1;
      }
    }
LAB_0016cf52:
    if (bVar11) {
      pcVar6 = "stairs";
    }
    else if (bVar12) {
      pcVar6 = "ladder";
    }
    else {
      pcVar6 = surface((int)u.ux,(int)u.uy);
    }
    floating_above(pcVar6);
    return 0;
  }
  if ((youmonst.data)->mlet == '\x05') goto LAB_0016cf52;
  if (bVar11 || bVar12) {
    ptVar7 = (trap *)0x0;
  }
  else {
    ptVar7 = t_at(level,(int)u.ux,(int)u.uy);
    if ((((ptVar7 == (trap *)0x0) || (bVar10 = ptVar7->field_0x8 & 0x1f, 3 < (byte)(bVar10 - 0xb)))
        || ((bVar3 = can_fall_thru(level), bVar3 == '\0' && ((byte)(bVar10 - 0xd) < 2)))) ||
       ((ptVar7->field_0x8 & 0x20) == 0)) {
      if ((((uwep != (obj *)0x0 && flags.autodig != '\0') && flags.nopick == '\0') &&
          ((byte)(uwep->oclass | 4U) == 6)) && (objects[uwep->otyp].oc_subtyp == '\x04'))
      goto LAB_0016d095;
      pcVar6 = "You can\'t go down here.";
      goto LAB_0016d0b6;
    }
  }
  if (u.ustuck != (monst *)0x0) {
    if ((u._1052_1_ & 1) == 0) {
      pcVar6 = "being held";
    }
    else {
      pcVar6 = "swallowed";
      if (((u.ustuck)->data->mflags1 & 0x40000) == 0) {
        pcVar6 = "engulfed";
      }
    }
    pline("You are %s, and cannot go down.",pcVar6);
    return 1;
  }
  bVar3 = on_level(&dungeon_topology.d_valley_level,&u.uz);
  if ((bVar3 != '\0') && ((u.uevent._1_1_ & 4) == 0)) {
    pline("You are standing at the gate to Gehennom.");
    pline("Unspeakable cruelty and harm lurk down there.");
    cVar4 = yn_function("Are you sure you want to enter?","yn",'n');
    if (cVar4 != 'y') {
      return 0;
    }
    pline("So be it.");
    u.uevent._1_1_ = u.uevent._1_1_ | 4;
  }
  bVar3 = next_to_u();
  if (bVar3 == '\0') {
    pcVar6 = "You are held back by your pet!";
LAB_0016d0b6:
    pline(pcVar6);
    return 0;
  }
  if (ptVar7 != (trap *)0x0) {
    if ((byte)((ptVar7->field_0x8 & 0x1f) - 0xb) < 2) {
      if ((u.utrap == 0) || (u.utraptype != 1)) {
        u.utrap = 1;
        u.utraptype = 1;
        pcVar6 = locomotion(youmonst.data,"go");
        pcVar8 = "You %s down into the pit.";
LAB_0016cede:
        pline(pcVar8,pcVar6);
        return 0;
      }
      if ((((uwep != (obj *)0x0 && flags.autodig != '\0') && flags.nopick == '\0') &&
          ((byte)(uwep->oclass | 4U) == 6)) && (objects[uwep->otyp].oc_subtyp == '\x04')) {
LAB_0016d095:
        iVar5 = use_pick_axe2(uwep,'\0','\0','\x01');
        return iVar5;
      }
      pcVar6 = "You are already in the pit.";
      goto LAB_0016d0b6;
    }
    pcVar6 = locomotion(youmonst.data,"jump");
    pcVar8 = "through the trap door";
    if ((ptVar7->field_0x8 & 0x1f) == 0xd) {
      pcVar8 = "down the hole";
    }
    pline("You %s %s.",pcVar6,pcVar8);
    bVar3 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
    if (bVar3 != '\0') {
      goto_hell('\0','\x01');
      return 1;
    }
  }
  at_ladder = level->locations[u.ux][u.uy].typ == '\x1b';
  next_level(ptVar7 == (trap *)0x0);
  at_ladder = '\0';
  return 1;
}

Assistant:

int dodown(void)
{
	struct trap *trap = 0;
	boolean stairs_down = ((u.ux == level->dnstair.sx && u.uy == level->dnstair.sy) ||
		(u.ux == level->sstairs.sx && u.uy == level->sstairs.sy && !level->sstairs.up)),
		ladder_down = (u.ux == level->dnladder.sx && u.uy == level->dnladder.sy);

	if (u.usteed && !u.usteed->mcanmove) {
		pline("%s won't move!", Monnam(u.usteed));
		return 0;
	} else if (u.usteed && u.usteed->meating) {
		pline("%s is still eating.", Monnam(u.usteed));
		return 0;
	} else if (Levitation) {
	    if ((HLevitation & I_SPECIAL) || (ELevitation & W_ARTI)) {
		/* end controlled levitation */
		if (ELevitation & W_ARTI) {
		    struct obj *obj;

		    for (obj = invent; obj; obj = obj->nobj) {
			if (obj->oartifact &&
					artifact_has_invprop(obj,LEVITATION)) {
			    if (obj->age < moves)
				obj->age = moves + rnz(100);
			    else
				obj->age += rnz(100);
			}
		    }
		}
		if (float_down(I_SPECIAL|TIMEOUT, W_ARTI))
		    return 1;   /* came down, so moved */
	    }
	    floating_above(stairs_down ? "stairs" : ladder_down ?
			   "ladder" : surface(u.ux, u.uy));
	    return 0;   /* didn't move */
	}
	if (!stairs_down && !ladder_down) {
		boolean can_fall;
		trap = t_at(level, u.ux, u.uy);
		can_fall = trap && (trap->ttyp == TRAPDOOR || trap->ttyp == HOLE);
		if (!trap ||
			(trap->ttyp != TRAPDOOR && trap->ttyp != HOLE &&
			 trap->ttyp != PIT && trap->ttyp != SPIKED_PIT)
			|| (!can_fall_thru(level) && can_fall) || !trap->tseen) {

			if (flags.autodig && !flags.nopick &&
				uwep && is_pick(uwep)) {
				return use_pick_axe2(uwep, 0, 0, 1);
			} else {
				pline("You can't go down here.");
				return 0;
			}
		}
	}
	if (u.ustuck) {
		pline("You are %s, and cannot go down.",
			!u.uswallow ? "being held" : is_animal(u.ustuck->data) ?
			"swallowed" : "engulfed");
		return 1;
	}
	if (on_level(&valley_level, &u.uz) && !u.uevent.gehennom_entered) {
		pline("You are standing at the gate to Gehennom.");
		pline("Unspeakable cruelty and harm lurk down there.");
		if (yn("Are you sure you want to enter?") != 'y')
			return 0;
		else pline("So be it.");
		u.uevent.gehennom_entered = 1;	/* don't ask again */
	}

	if (!next_to_u()) {
		pline("You are held back by your pet!");
		return 0;
	}

	if (trap) {
		if (trap->ttyp == PIT || trap->ttyp == SPIKED_PIT) {
			if (u.utrap && (u.utraptype == TT_PIT)) {
				if (flags.autodig && !flags.nopick &&
					uwep && is_pick(uwep)) {
				    return use_pick_axe2(uwep, 0, 0, 1);
				} else {
				    /* YAFM needed */
				    pline("You are already in the pit.");
				}
			} else {
				u.utrap = 1;
				u.utraptype = TT_PIT;
				pline("You %s down into the pit.",
					locomotion(youmonst.data, "go"));
			}
			return 0;
		} else {
			pline("You %s %s.", locomotion(youmonst.data, "jump"),
				trap->ttyp == HOLE ? "down the hole" :
				                     "through the trap door");
		}
	}

	if (trap && Is_stronghold(&u.uz)) {
		goto_hell(FALSE, TRUE);
	} else {
		at_ladder = (boolean) (level->locations[u.ux][u.uy].typ == LADDER);
		next_level(!trap);
		at_ladder = FALSE;
	}
	return 1;
}